

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall CUI::RenderTooltip(CUI *this)

{
  float *pfVar1;
  int iVar2;
  int64 iVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  float fVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  CTextBoundingBox CVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  vec4 local_48;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_38;
  float local_34;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_pActiveTooltip == (void *)0x0) || (this->m_aTooltipText[0] == '\0')) {
    RenderTooltip::s_pLastTooltip = (void *)0x0;
  }
  else {
    iVar3 = time_get();
    if (RenderTooltip::s_pLastTooltip != this->m_pActiveTooltip) {
      RenderTooltip::s_pLastTooltip = this->m_pActiveTooltip;
      RenderTooltip::s_TooltipActivationStart = iVar3;
    }
    fVar4 = (float)(iVar3 - RenderTooltip::s_TooltipActivationStart);
    iVar3 = time_freq();
    fVar4 = fVar4 / (float)iVar3;
    if (0.75 <= fVar4) {
      (this->m_Screen).h = 600.0;
      (this->m_Screen).w =
           ((float)this->m_pGraphics->m_ScreenWidth / (float)this->m_pGraphics->m_ScreenHeight) *
           600.0;
      if (RenderTooltip()::s_Cursor == '\0') {
        iVar2 = __cxa_guard_acquire(&RenderTooltip()::s_Cursor);
        if (iVar2 != 0) {
          CTextCursor::CTextCursor(&RenderTooltip::s_Cursor);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderTooltip::s_Cursor,&__dso_handle);
          __cxa_guard_release(&RenderTooltip()::s_Cursor);
        }
      }
      uVar5 = 0x3f800000;
      uVar8 = 0;
      auVar9 = ZEXT416(-(uint)(fVar4 < 1.0) & (uint)((fVar4 + -0.75) * 4.0) |
                       ~-(uint)(fVar4 < 1.0) & 0x3f800000);
      CTextCursor::Reset(&RenderTooltip::s_Cursor,-1);
      RenderTooltip::s_Cursor.m_FontSize = 10.0;
      RenderTooltip::s_Cursor.m_MaxLines = -1;
      RenderTooltip::s_Cursor.m_MaxWidth = (this->m_Screen).w * 0.25;
      RenderTooltip::s_Cursor.m_Flags = 10;
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[0xd])();
      uVar12 = extraout_XMM0_Da;
      uVar13 = extraout_XMM0_Dc;
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000);
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                (this->m_pTextRender,&RenderTooltip::s_Cursor,this->m_aTooltipText,0xffffffff,in_R8,
                 in_R9,auVar9,uVar12,uVar13,uVar5,uVar8);
      fVar11 = auVar9._0_4_;
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[4])(uVar12,extraout_XMM0_Db);
      CVar10 = CTextCursor::AlignedBoundingBox(&RenderTooltip::s_Cursor);
      local_38 = (anon_union_4_2_94730284_for_vector2_base<float>_1)this->m_MouseX;
      fVar4 = (this->m_TooltipAnchor).h;
      local_34 = (this->m_TooltipAnchor).y + fVar4 + 4.0;
      fVar6 = CVar10.w + 10.0;
      fVar7 = CVar10.h + 10.0;
      local_30 = CONCAT44(fVar7,fVar6);
      pfVar1 = &(this->m_Screen).w;
      if (*pfVar1 <= local_38.x + fVar6 && local_38.x + fVar6 != *pfVar1) {
        local_38.x = local_38.x - fVar6;
      }
      pfVar1 = &(this->m_Screen).h;
      if (*pfVar1 <= fVar7 + local_34 && fVar7 + local_34 != *pfVar1) {
        local_34 = local_34 - (fVar7 + 8.0 + fVar4);
      }
      local_48.field_3.w = fVar11 * 0.4;
      local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
      local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
      local_48.field_2.z = 0.0;
      CUIRect::Draw((CUIRect *)&local_38,&local_48,4.0,0xf);
      CUIRect::Margin((CUIRect *)&local_38,1.0,(CUIRect *)&local_38);
      local_48.field_3.w = fVar11 * 0.8;
      local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f000000;
      local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f000000;
      local_48.field_2.z = 0.5;
      CUIRect::Draw((CUIRect *)&local_38,&local_48,4.0,0xf);
      CUIRect::Margin((CUIRect *)&local_38,4.0,(CUIRect *)&local_38);
      RenderTooltip::s_Cursor.m_Align = 4;
      RenderTooltip::s_Cursor.m_CursorPos.field_1.y = local_30._4_4_ * 0.5 + local_34;
      RenderTooltip::s_Cursor.m_CursorPos.field_0 = local_38;
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[0x10])
                (0x3f800000,this->m_pTextRender,&RenderTooltip::s_Cursor,0,0xffffffff);
      this->m_pActiveTooltip = (void *)0x0;
      this->m_aTooltipText[0] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::RenderTooltip()
{
	static const void *s_pLastTooltip = 0;
	if(!m_pActiveTooltip || !m_aTooltipText[0])
	{
		s_pLastTooltip = 0;
		return;
	}
	const int64 Now = time_get();
	static int64 s_TooltipActivationStart = 0;
	if(s_pLastTooltip != m_pActiveTooltip)
	{
		// Reset the fade in timer if a new tooltip got active
		s_TooltipActivationStart = Now;
		s_pLastTooltip = m_pActiveTooltip;
	}

	const float SecondsBeforeFadeIn = 0.75f;
	const float SecondsSinceActivation = (Now - s_TooltipActivationStart)/(float)time_freq();
	if(SecondsSinceActivation < SecondsBeforeFadeIn)
		return;
	const float SecondsFadeIn = 0.25f;
	const float AlphaFactor = SecondsSinceActivation < SecondsBeforeFadeIn+SecondsFadeIn ? (SecondsSinceActivation-SecondsBeforeFadeIn)/SecondsFadeIn : 1.0f;
	const CUIRect *pScreen = Screen();

	static CTextCursor s_Cursor;
	s_Cursor.Reset();
	s_Cursor.m_FontSize = 10.0f;
	s_Cursor.m_MaxLines = -1;
	s_Cursor.m_MaxWidth = pScreen->w/4.0f;
	s_Cursor.m_Flags = TEXTFLAG_ALLOW_NEWLINE|TEXTFLAG_WORD_WRAP;
	vec4 OldTextColor = TextRender()->GetColor();
	TextRender()->TextColor(1.0f, 1.0f, 1.0f, AlphaFactor);
	TextRender()->TextDeferred(&s_Cursor, m_aTooltipText, -1);
	TextRender()->TextColor(OldTextColor);

	// Position tooltip below hovered rect, to the right of the mouse cursor.
	// If the tooltip would overflow the screen, position it to the top and/or left instead.
	CTextBoundingBox BoundingBox = s_Cursor.BoundingBox();
	const float Rounding = 4.0f;
	const float Spacing = 4.0f;
	const float Border = 1.0f;
	CUIRect Tooltip = { MouseX(), m_TooltipAnchor.y + m_TooltipAnchor.h + Spacing, BoundingBox.w + 2 * (Spacing+Border), BoundingBox.h + 2 * (Spacing+Border) };
	if(Tooltip.x + Tooltip.w > pScreen->w)
		Tooltip.x -= Tooltip.w;
	if(Tooltip.y + Tooltip.h > pScreen->h)
		Tooltip.y -= Tooltip.h + 2 * Spacing + m_TooltipAnchor.h;
	Tooltip.Draw(vec4(0.0f, 0.0f, 0.0f, 0.4f * AlphaFactor), Rounding);
	Tooltip.Margin(Border, &Tooltip);
	Tooltip.Draw(vec4(0.5f, 0.5f, 0.5f, 0.8f * AlphaFactor), Rounding);
	Tooltip.Margin(Spacing, &Tooltip);
	ApplyCursorAlign(&s_Cursor, &Tooltip, TEXTALIGN_ML);
	TextRender()->DrawTextOutlined(&s_Cursor);

	// Clear active tooltip. DoTooltip must be called each render call.
	m_pActiveTooltip = 0;
	m_aTooltipText[0] = '\0';
}